

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O1

void DrawTextCodepoint(Font font,int codepoint,Vector2 position,float fontSize,Color tint)

{
  long lVar1;
  CharInfo *pCVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Rectangle source;
  Rectangle dest;
  
  if ((long)font.charsCount < 1) {
    lVar1 = 0x3f;
  }
  else {
    lVar1 = 0;
    pCVar2 = font.chars;
    do {
      if (pCVar2->value == codepoint) goto LAB_001325ec;
      lVar1 = lVar1 + 1;
      pCVar2 = pCVar2 + 1;
    } while (font.charsCount != lVar1);
    lVar1 = 0x3f;
LAB_001325ec:
    lVar1 = (long)(int)lVar1;
  }
  fVar3 = fontSize / (float)font.baseSize;
  fVar4 = (float)font.charsPadding;
  dest.x = (float)font.chars[lVar1].offsetX * fVar3 + position.x + -fVar4 * fVar3;
  dest.y = (float)font.chars[lVar1].offsetY * fVar3 + position.y + -fVar4 * fVar3;
  source.x = font.recs[lVar1].x - fVar4;
  fVar6 = font.recs[lVar1].width + fVar4 + fVar4;
  fVar5 = fVar4 + fVar4 + font.recs[lVar1].height;
  dest.width = fVar3 * fVar6;
  dest.height = fVar3 * fVar5;
  source.y = font.recs[lVar1].y - fVar4;
  source.height = fVar5;
  source.width = fVar6;
  DrawTexturePro(font.texture,source,dest,(Vector2)0x0,0.0,tint);
  return;
}

Assistant:

void DrawTextCodepoint(Font font, int codepoint, Vector2 position, float fontSize, Color tint)
{
    // Character index position in sprite font
    // NOTE: In case a codepoint is not available in the font, index returned points to '?'
    int index = GetGlyphIndex(font, codepoint);
    float scaleFactor = fontSize/font.baseSize;     // Character quad scaling factor

    // Character destination rectangle on screen
    // NOTE: We consider charsPadding on drawing
    Rectangle dstRec = { position.x + font.chars[index].offsetX*scaleFactor - (float)font.charsPadding*scaleFactor,
                      position.y + font.chars[index].offsetY*scaleFactor - (float)font.charsPadding*scaleFactor,
                      (font.recs[index].width + 2.0f*font.charsPadding)*scaleFactor,
                      (font.recs[index].height + 2.0f*font.charsPadding)*scaleFactor };

    // Character source rectangle from font texture atlas
    // NOTE: We consider chars padding when drawing, it could be required for outline/glow shader effects
    Rectangle srcRec = { font.recs[index].x - (float)font.charsPadding, font.recs[index].y - (float)font.charsPadding,
                         font.recs[index].width + 2.0f*font.charsPadding, font.recs[index].height + 2.0f*font.charsPadding };

    // Draw the character texture on the screen
    DrawTexturePro(font.texture, srcRec, dstRec, (Vector2){ 0, 0 }, 0.0f, tint);
}